

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall xercesc_4_0::AbstractDOMParser::initialize(AbstractDOMParser *this)

{
  GrammarResolver *this_00;
  XMLStringPool *pXVar1;
  XMLScanner *pXVar2;
  AbstractDOMParser *this_local;
  
  this_00 = (GrammarResolver *)XMemory::operator_new(0x50,this->fMemoryManager);
  GrammarResolver::GrammarResolver(this_00,this->fGrammarPool,this->fMemoryManager);
  this->fGrammarResolver = this_00;
  pXVar1 = GrammarResolver::getStringPool(this->fGrammarResolver);
  this->fURIStringPool = pXVar1;
  pXVar2 = XMLScannerResolver::getDefaultScanner
                     (this->fValidator,this->fGrammarResolver,this->fMemoryManager);
  this->fScanner = pXVar2;
  XMLScanner::setDocHandler(this->fScanner,&this->super_XMLDocumentHandler);
  XMLScanner::setDocTypeHandler(this->fScanner,&this->super_DocTypeHandler);
  XMLScanner::setURIStringPool(this->fScanner,this->fURIStringPool);
  reset(this);
  return;
}

Assistant:

void AbstractDOMParser::initialize()
{
    //  Create grammar resolver and string pool to pass to the scanner
    fGrammarResolver = new (fMemoryManager) GrammarResolver(fGrammarPool, fMemoryManager);
    fURIStringPool = fGrammarResolver->getStringPool();

    //  Create a scanner and tell it what validator to use. Then set us
    //  as the document event handler so we can fill the DOM document.
    fScanner = XMLScannerResolver::getDefaultScanner(fValidator, fGrammarResolver, fMemoryManager);
    fScanner->setDocHandler(this);
    fScanner->setDocTypeHandler(this);
    fScanner->setURIStringPool(fURIStringPool);

    this->reset();
}